

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O2

void recfield(LexState *ls,ConsControl *cc)

{
  lu_byte lVar1;
  FuncState *fs;
  expdesc *peVar2;
  expdesc key;
  expdesc tab;
  expdesc val;
  
  fs = ls->fs;
  lVar1 = fs->freereg;
  if ((ls->t).token == 0x123) {
    luaY_checklimit(fs,cc->nh,0x3fffffff,"items in a constructor");
    key.u.strval = str_checkname(ls);
    key.t = -1;
    key.f = -1;
    key.k = VKSTR;
  }
  else {
    yindex(ls,&key);
  }
  cc->nh = cc->nh + 1;
  checknext(ls,0x3d);
  peVar2 = cc->t;
  tab.t = peVar2->t;
  tab.f = peVar2->f;
  tab.k = peVar2->k;
  tab._4_4_ = *(undefined4 *)&peVar2->field_0x4;
  tab.u = peVar2->u;
  luaK_indexed(fs,&tab,&key);
  expr(ls,&val);
  luaK_storevar(fs,&tab,&val);
  fs->freereg = lVar1;
  return;
}

Assistant:

static void recfield (LexState *ls, ConsControl *cc) {
  /* recfield -> (NAME | '['exp']') = exp */
  FuncState *fs = ls->fs;
  lu_byte reg = ls->fs->freereg;
  expdesc tab, key, val;
  if (ls->t.token == TK_NAME) {
    luaY_checklimit(fs, cc->nh, INT_MAX / 2, "items in a constructor");
    codename(ls, &key);
  }
  else  /* ls->t.token == '[' */
    yindex(ls, &key);
  cc->nh++;
  checknext(ls, '=');
  tab = *cc->t;
  luaK_indexed(fs, &tab, &key);
  expr(ls, &val);
  luaK_storevar(fs, &tab, &val);
  fs->freereg = reg;  /* free registers */
}